

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

bool __thiscall QDockWidgetPrivate::mousePressEvent(QDockWidgetPrivate *this,QMouseEvent *event)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  QDockWidgetLayout *this_00;
  long lVar5;
  long lVar6;
  bool bVar7;
  long in_FS_OFFSET;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  QPointF local_50;
  QPoint local_40;
  QPoint local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidgetPrivate).field_0x8;
  this_00 = (QDockWidgetLayout *)QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
  bVar3 = QDockWidgetLayout::nativeWindowDeco(this_00);
  if (!bVar3) {
    local_38.xp.m_i = (this_00->_titleArea).x1.m_i;
    local_38.yp.m_i = (this_00->_titleArea).y1.m_i;
    uStack_30._0_4_ = (this_00->_titleArea).x2;
    uStack_30._4_4_ = (this_00->_titleArea).y2;
    lVar5 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
    if (*(int *)(event + 0x40) == 1) {
      auVar10 = QEventPoint::position();
      dVar9 = (double)((ulong)auVar10._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
              auVar10._0_8_;
      bVar3 = 2147483647.0 < dVar9;
      if (dVar9 <= -2147483648.0) {
        dVar9 = -2147483648.0;
      }
      dVar8 = (double)((ulong)auVar10._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
              auVar10._8_8_;
      bVar7 = 2147483647.0 < dVar8;
      if (dVar8 <= -2147483648.0) {
        dVar8 = -2147483648.0;
      }
      local_50.xp = (qreal)CONCAT44((int)(double)(-(ulong)bVar7 & 0x41dfffffffc00000 |
                                                 ~-(ulong)bVar7 & (ulong)dVar8),
                                    (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                                 ~-(ulong)bVar3 & (ulong)dVar9));
      cVar4 = QRect::contains(&local_38,SUB81(&local_50,0));
      if ((cVar4 != '\0') &&
         ((((this->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
            super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 2) != 0 ||
          ((*(byte *)(*(long *)(lVar2 + 0x20) + 0xc) & 1) != 0)))) {
        lVar6 = QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
        if (lVar5 != 0 || lVar6 != 0) {
          bVar3 = isAnimating(this);
          if ((!bVar3) && (this->state == (DragState *)0x0)) {
            local_50 = (QPointF)QEventPoint::position();
            local_40 = QPointF::toPoint(&local_50);
            initDrag(this,&local_40,false);
            bVar3 = true;
            if (this->state != (DragState *)0x0) {
              uVar1 = (this->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                      super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i;
              if (((uVar1 & 4) == 0) || (bVar7 = true, ((byte)event[0x23] & 4) == 0)) {
                if ((uVar1 & 2) == 0) {
                  bVar7 = (bool)(*(byte *)(*(long *)(lVar2 + 0x20) + 0xc) & 1);
                }
                else {
                  bVar7 = false;
                }
              }
              this->state->ctrlDrag = bVar7;
            }
            goto LAB_004000a6;
          }
        }
      }
    }
  }
  bVar3 = false;
LAB_004000a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockWidgetPrivate::mousePressEvent(QMouseEvent *event)
{
#if QT_CONFIG(mainwindow)
    Q_Q(QDockWidget);

    QDockWidgetLayout *dwLayout
        = qobject_cast<QDockWidgetLayout*>(layout);

    if (!dwLayout->nativeWindowDeco()) {
        QRect titleArea = dwLayout->titleArea();

        QDockWidgetGroupWindow *floatingTab = qobject_cast<QDockWidgetGroupWindow*>(parent);

        if (event->button() != Qt::LeftButton ||
            !titleArea.contains(event->position().toPoint()) ||
            // check if the tool window is movable... do nothing if it
            // is not (but allow moving if the window is floating)
            (!hasFeature(this, QDockWidget::DockWidgetMovable) && !q->isFloating()) ||
            (qobject_cast<QMainWindow*>(parent) == nullptr && !floatingTab) ||
            isAnimating() || state != nullptr) {
            return false;
        }

        initDrag(event->position().toPoint(), false);

        if (state)
            state->ctrlDrag = (hasFeature(this, QDockWidget::DockWidgetFloatable) && event->modifiers() & Qt::ControlModifier) ||
                              (!hasFeature(this, QDockWidget::DockWidgetMovable) && q->isFloating());

        return true;
    }

#endif // QT_CONFIG(mainwindow)
    return false;
}